

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderIndexingTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::ShaderIndexingTests::init(ShaderIndexingTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  bool bVar2;
  deUint32 dVar3;
  int iVar4;
  _Alloc_hider _Var5;
  _Alloc_hider _Var6;
  uint uVar7;
  int iVar8;
  int iVar9;
  DataType dataType;
  TestNode *pTVar10;
  char *pcVar11;
  long *plVar12;
  ShaderIndexingCase *pSVar13;
  size_t sVar14;
  ostringstream *poVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  long lVar17;
  char *pcVar18;
  long *plVar19;
  size_type *psVar20;
  _func_int **pp_Var21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  char *pcVar25;
  long lVar26;
  ostringstream *poVar27;
  long lVar28;
  ShaderEvalFunc p_Var29;
  DataType DVar30;
  _Base_ptr *pp_Var31;
  long lVar32;
  long lVar33;
  code *evalFunc;
  bool bVar34;
  StringTemplate vertTemplate;
  _Alloc_hider local_498;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  string vertexShaderSource;
  allocator<char> local_451;
  StringTemplate fragTemplate;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  string local_3f8;
  ulong local_3d8;
  undefined8 local_3d0;
  string desc;
  string name;
  long local_348;
  ostringstream vtx;
  ostringstream frag;
  
  pTVar10 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar10,pCVar1->m_testCtx,"varying_array",
             "Varying array access tests.");
  pTVar10->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215e3d0;
  pTVar10[1]._vptr_TestNode = (_func_int **)pCVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar10);
  lVar23 = 0;
  do {
    DVar30 = Performance::ShaderOperatorTests::init()::floatTypes[lVar23];
    uVar22 = 0;
    do {
      lVar24 = 0x1d;
      if (uVar22 == 1) {
        lVar24 = 0x37;
      }
      local_3d0 = (&getIndexAccessTypeName(deqp::gles2::Functional::IndexAccessType)::s_names)
                  [uVar22];
      pcVar25 = "uniform mediump int ui_four;\n";
      if (uVar22 == 1) {
        pcVar25 = "uniform mediump int ui_zero, ui_one, ui_two, ui_three;\n";
      }
      lVar17 = 0x23;
      if (uVar22 == 2) {
        lVar17 = 0x1d;
      }
      pcVar18 = "\tfor (int i = 0; i < ui_four; i++)\n";
      if (uVar22 == 2) {
        pcVar18 = "\tfor (int i = 0; i < 4; i++)\n";
      }
      lVar33 = 0;
      local_3d8 = uVar22;
      do {
        pp_Var31 = &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        pcVar11 = glu::getDataTypeName(DVar30);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&fragTemplate,pcVar11,(allocator<char> *)&vertexShaderSource);
        plVar12 = (long *)std::__cxx11::string::append((char *)&fragTemplate);
        plVar19 = plVar12 + 2;
        if ((long *)*plVar12 == plVar19) {
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar19;
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar12[3];
          params._M_t._M_impl._0_8_ = pp_Var31;
        }
        else {
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar19;
          params._M_t._M_impl._0_8_ = (long *)*plVar12;
        }
        params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar12[1];
        *plVar12 = (long)plVar19;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::append((char *)&params);
        vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
        psVar20 = (size_type *)(plVar12 + 2);
        if ((size_type *)*plVar12 == psVar20) {
          vertTemplate.m_template.field_2._M_allocated_capacity = *psVar20;
          vertTemplate.m_template.field_2._8_8_ = plVar12[3];
        }
        else {
          vertTemplate.m_template.field_2._M_allocated_capacity = *psVar20;
          vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar12;
        }
        vertTemplate.m_template._M_string_length = plVar12[1];
        *plVar12 = (long)psVar20;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
        frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
        pp_Var21 = (_func_int **)(plVar12 + 2);
        if ((_func_int **)*plVar12 == pp_Var21) {
          frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
          frag.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar12[3];
        }
        else {
          frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
          frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
               (_func_int **)*plVar12;
        }
        frag.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar12[1];
        *plVar12 = (long)pp_Var21;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::append((char *)&frag);
        vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
        pp_Var21 = (_func_int **)(plVar12 + 2);
        if ((_func_int **)*plVar12 == pp_Var21) {
          vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
          vtx.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar12[3];
        }
        else {
          vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
          vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
               (_func_int **)*plVar12;
        }
        vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar12[1];
        *plVar12 = (long)pp_Var21;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::append((char *)&vtx);
        name._M_dataplus._M_p = (pointer)&name.field_2;
        psVar20 = (size_type *)(plVar12 + 2);
        if ((size_type *)*plVar12 == psVar20) {
          name.field_2._M_allocated_capacity = *psVar20;
          name.field_2._8_8_ = plVar12[3];
        }
        else {
          name.field_2._M_allocated_capacity = *psVar20;
          name._M_dataplus._M_p = (pointer)*plVar12;
        }
        name._M_string_length = plVar12[1];
        *plVar12 = (long)psVar20;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
            (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
          operator_delete(vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                          ,vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
        }
        if (frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
            (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
          operator_delete(frag.super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream,
                          frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
          operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                          vertTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        if ((_Base_ptr *)params._M_t._M_impl._0_8_ != pp_Var31) {
          operator_delete((void *)params._M_t._M_impl._0_8_,
                          (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
          operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                          fragTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        params._M_t._M_impl._0_8_ = pp_Var31;
        std::__cxx11::string::_M_construct<char_const*>((string *)&params,"Varying array with ","");
        plVar12 = (long *)std::__cxx11::string::append((char *)&params);
        vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
        psVar20 = (size_type *)(plVar12 + 2);
        if ((size_type *)*plVar12 == psVar20) {
          vertTemplate.m_template.field_2._M_allocated_capacity = *psVar20;
          vertTemplate.m_template.field_2._8_8_ = plVar12[3];
        }
        else {
          vertTemplate.m_template.field_2._M_allocated_capacity = *psVar20;
          vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar12;
        }
        vertTemplate.m_template._M_string_length = plVar12[1];
        *plVar12 = (long)psVar20;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
        frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
        pp_Var21 = (_func_int **)(plVar12 + 2);
        if ((_func_int **)*plVar12 == pp_Var21) {
          frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
          frag.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar12[3];
        }
        else {
          frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
          frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
               (_func_int **)*plVar12;
        }
        frag.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar12[1];
        *plVar12 = (long)pp_Var21;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::append((char *)&frag);
        vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
        pp_Var21 = (_func_int **)(plVar12 + 2);
        if ((_func_int **)*plVar12 == pp_Var21) {
          vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
          vtx.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar12[3];
        }
        else {
          vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
          vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
               (_func_int **)*plVar12;
        }
        vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar12[1];
        *plVar12 = (long)pp_Var21;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::append((char *)&vtx);
        desc._M_dataplus._M_p = (pointer)&desc.field_2;
        psVar20 = (size_type *)(plVar12 + 2);
        if ((size_type *)*plVar12 == psVar20) {
          desc.field_2._M_allocated_capacity = *psVar20;
          desc.field_2._8_8_ = plVar12[3];
        }
        else {
          desc.field_2._M_allocated_capacity = *psVar20;
          desc._M_dataplus._M_p = (pointer)*plVar12;
        }
        desc._M_string_length = plVar12[1];
        *plVar12 = (long)psVar20;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
            (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
          operator_delete(vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                          ,vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
        }
        if (frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
            (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
          operator_delete(frag.super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream,
                          frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
          operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                          vertTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        if ((_Base_ptr *)params._M_t._M_impl._0_8_ != pp_Var31) {
          operator_delete((void *)params._M_t._M_impl._0_8_,
                          (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        _Var6._M_p = name._M_dataplus._M_p;
        _Var5._M_p = desc._M_dataplus._M_p;
        pCVar1 = (this->super_TestCaseGroup).m_context;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&vtx,"attribute highp vec4 a_position;\n",0x21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&vtx,"attribute highp vec4 a_coords;\n",0x1f);
        if ((local_3d8 | 2) == 3) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,pcVar25,lVar24);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&vtx,"varying ${PRECISION} ${VAR_TYPE} var[${ARRAY_LEN}];\n",0x34);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"void main()\n",0xc);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"{\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&vtx,"\tgl_Position = a_position;\n",0x1b);
        if (local_3d8 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                     "\tvar[0] = ${VAR_TYPE}(a_coords);\n",0x21);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                     "\tvar[1] = ${VAR_TYPE}(a_coords) * 0.5;\n",0x27);
          lVar26 = 0x29;
          std::__ostream_insert<char,std::char_traits<char>>
                    (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                     "\tvar[2] = ${VAR_TYPE}(a_coords) * 0.25;\n",0x28);
          pcVar11 = "\tvar[3] = ${VAR_TYPE}(a_coords) * 0.125;\n";
        }
        else if (local_3d8 == 1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                     "\tvar[ui_zero]  = ${VAR_TYPE}(a_coords);\n",0x28);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                     "\tvar[ui_one]   = ${VAR_TYPE}(a_coords) * 0.5;\n",0x2e);
          lVar26 = 0x30;
          std::__ostream_insert<char,std::char_traits<char>>
                    (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                     "\tvar[ui_two]   = ${VAR_TYPE}(a_coords) * 0.25;\n",0x2f);
          pcVar11 = "\tvar[ui_three] = ${VAR_TYPE}(a_coords) * 0.125;\n";
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                     "\t${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(a_coords);\n",0x3a);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,pcVar18,lVar17);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\t{\n",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                     "\t\tvar[i] = ${VAR_TYPE}(coords);\n",0x20);
          lVar26 = 3;
          std::__ostream_insert<char,std::char_traits<char>>
                    (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                     "\t\tcoords = coords * 0.5;\n",0x19);
          pcVar11 = "\t}\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,pcVar11,lVar26);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"}\n",2);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&frag,"precision mediump int;\n",0x17);
        lVar26 = 0x37;
        pcVar11 = "uniform mediump int ui_zero, ui_one, ui_two, ui_three;\n";
        if (lVar33 == 8) {
LAB_00eefaf0:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar11,lVar26);
        }
        else {
          lVar26 = 0x15;
          pcVar11 = "uniform int ui_four;\n";
          if (lVar33 == 0x18) goto LAB_00eefaf0;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&frag,"varying ${PRECISION} ${VAR_TYPE} var[${ARRAY_LEN}];\n",0x34);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"void main()\n",0xc);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"{\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&frag,"\t${PRECISION} ${VAR_TYPE} res = ${VAR_TYPE}(0.0);\n",0x32);
        if (lVar33 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&frag,"\tres += var[0];\n",0x10);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&frag,"\tres += var[1];\n",0x10);
          lVar26 = 0x10;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&frag,"\tres += var[2];\n",0x10);
          pcVar11 = "\tres += var[3];\n";
        }
        else if (lVar33 == 8) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&frag,"\tres += var[ui_zero];\n",0x16);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&frag,"\tres += var[ui_one];\n",0x15);
          lVar26 = 0x17;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&frag,"\tres += var[ui_two];\n",0x15);
          pcVar11 = "\tres += var[ui_three];\n";
        }
        else {
          pcVar11 = "\tfor (int i = 0; i < ui_four; i++)\n";
          if (lVar33 == 0x10) {
            pcVar11 = "\tfor (int i = 0; i < 4; i++)\n";
          }
          lVar32 = 0x23;
          if (lVar33 == 0x10) {
            lVar32 = 0x1d;
          }
          lVar26 = 0x11;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar11,lVar32);
          pcVar11 = "\t\tres += var[i];\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar11,lVar26);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&frag,"\tgl_FragColor = vec4(res${PADDING});\n",0x25);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"}\n",2);
        params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &params._M_t._M_impl.super__Rb_tree_header._M_header;
        params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(DVar30);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[9],_const_char_*,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate,(char (*) [9])0x1bc23a9,(char **)&fragTemplate);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&params,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_p != &local_488) {
          operator_delete(local_498._M_p,local_488._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
          operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                          vertTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[10],_const_char_(&)[2],_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate,(char (*) [10])"ARRAY_LEN",(char (*) [2])0x1c01ff7);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&params,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_p != &local_488) {
          operator_delete(local_498._M_p,local_488._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
          operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                          vertTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate,(char (*) [10])0x1cf2bdb,(char (*) [8])0x1c00dfd);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&params,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_p != &local_488) {
          operator_delete(local_498._M_p,local_488._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
          operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                          vertTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        if (DVar30 == TYPE_FLOAT_VEC3) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [6])0x1bbf031);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        else if (DVar30 == TYPE_FLOAT_VEC2) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [11])0x1bbf02c);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        else if (DVar30 == TYPE_FLOAT) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[16],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [16])", 0.0, 0.0, 1.0");
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        else {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",
                     (char (*) [1])(glcts::fixed_sample_locations_values + 1));
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_p != &local_488) {
          operator_delete(local_498._M_p,local_488._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
          operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                          vertTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&fragTemplate.m_template,vertexShaderSource._M_dataplus._M_p,
                   (allocator<char> *)&local_3f8);
        tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
          operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                          fragTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
          operator_delete(vertexShaderSource._M_dataplus._M_p,
                          vertexShaderSource.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&vertexShaderSource,local_3f8._M_dataplus._M_p,&local_451);
        tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
          operator_delete(vertexShaderSource._M_dataplus._M_p,
                          vertexShaderSource.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
        tcu::StringTemplate::specialize(&local_3f8,&fragTemplate,&params);
        if (DVar30 - TYPE_FLOAT < 4) {
          p_Var29 = (ShaderEvalFunc)(&PTR_evalArrayCoordsFloat_02165bc0)[DVar30 - TYPE_FLOAT];
        }
        else {
          p_Var29 = (ShaderEvalFunc)0x0;
        }
        pSVar13 = (ShaderIndexingCase *)operator_new(0x130);
        uVar7 = (uint)(local_3d8 == 1 || lVar33 == 8);
        if (local_3d8 == 3) {
          uVar7 = 3;
        }
        dVar3 = uVar7 | 5;
        if (lVar33 != 0x18) {
          dVar3 = uVar7;
        }
        ShaderIndexingCase::ShaderIndexingCase
                  (pSVar13,pCVar1,_Var6._M_p,_Var5._M_p,true,DVar30,p_Var29,dVar3,
                   vertexShaderSource._M_dataplus._M_p,local_3f8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
          operator_delete(vertexShaderSource._M_dataplus._M_p,
                          vertexShaderSource.field_2._M_allocated_capacity + 1);
        }
        tcu::StringTemplate::~StringTemplate(&fragTemplate);
        tcu::StringTemplate::~StringTemplate(&vertTemplate);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&params._M_t);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
        std::ios_base::~ios_base
                  ((ios_base *)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
        std::ios_base::~ios_base
                  ((ios_base *)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
        tcu::TestNode::addChild(pTVar10,(TestNode *)pSVar13);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)desc._M_dataplus._M_p != &desc.field_2) {
          operator_delete(desc._M_dataplus._M_p,desc.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
        }
        lVar33 = lVar33 + 8;
      } while (lVar33 != 0x20);
      uVar22 = local_3d8 + 1;
    } while (uVar22 != 4);
    lVar23 = lVar23 + 1;
    if (lVar23 == 4) {
      pTVar10 = (TestNode *)operator_new(0x78);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar10,pCVar1->m_testCtx,"uniform_array",
                 "Uniform array access tests.");
      pTVar10->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215e3d0;
      pTVar10[1]._vptr_TestNode = (_func_int **)pCVar1;
      tcu::TestNode::addChild((TestNode *)this,pTVar10);
      lVar23 = 0;
      do {
        local_3d8 = (ulong)Performance::ShaderOperatorTests::init()::floatTypes[lVar23];
        uVar7 = Performance::ShaderOperatorTests::init()::floatTypes[lVar23] - TYPE_FLOAT;
        uVar22 = 0;
        do {
          local_3d0 = (&getIndexAccessTypeName(deqp::gles2::Functional::IndexAccessType)::s_names)
                      [uVar22];
          bVar34 = uVar22 == 1;
          lVar24 = 0x1d;
          if (bVar34) {
            lVar24 = 0x37;
          }
          pcVar25 = "uniform mediump int ui_four;\n";
          if (bVar34) {
            pcVar25 = "uniform mediump int ui_zero, ui_one, ui_two, ui_three;\n";
          }
          pcVar18 = "\tfor (int i = 0; i < ui_four; i++)\n";
          if (uVar22 == 2) {
            pcVar18 = "\tfor (int i = 0; i < 4; i++)\n";
          }
          lVar17 = 0x23;
          if (uVar22 == 2) {
            lVar17 = 0x1d;
          }
          lVar33 = 0;
          do {
            pp_Var31 = &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            glu::getShaderTypeName
                      (*(ShaderType *)
                        ((long)UniformCase::randomFeatures(unsigned_int)::arrayUsageChoices + lVar33
                        ));
            pcVar11 = glu::getDataTypeName((DataType)local_3d8);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&params,pcVar11,(allocator<char> *)&fragTemplate);
            plVar12 = (long *)std::__cxx11::string::append((char *)&params);
            vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
            psVar20 = (size_type *)(plVar12 + 2);
            if ((size_type *)*plVar12 == psVar20) {
              vertTemplate.m_template.field_2._M_allocated_capacity = *psVar20;
              vertTemplate.m_template.field_2._8_8_ = plVar12[3];
            }
            else {
              vertTemplate.m_template.field_2._M_allocated_capacity = *psVar20;
              vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar12;
            }
            vertTemplate.m_template._M_string_length = plVar12[1];
            *plVar12 = (long)psVar20;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            plVar12 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
            frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                 (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
            pp_Var21 = (_func_int **)(plVar12 + 2);
            if ((_func_int **)*plVar12 == pp_Var21) {
              frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
              frag.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar12[3];
            }
            else {
              frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
              frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)*plVar12;
            }
            frag.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar12[1];
            *plVar12 = (long)pp_Var21;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            plVar12 = (long *)std::__cxx11::string::append((char *)&frag);
            vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                 (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
            pp_Var21 = (_func_int **)(plVar12 + 2);
            if ((_func_int **)*plVar12 == pp_Var21) {
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar12[3];
            }
            else {
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)*plVar12;
            }
            vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar12[1];
            *plVar12 = (long)pp_Var21;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            plVar12 = (long *)std::__cxx11::string::append((char *)&vtx);
            name._M_dataplus._M_p = (pointer)&name.field_2;
            psVar20 = (size_type *)(plVar12 + 2);
            if ((size_type *)*plVar12 == psVar20) {
              name.field_2._M_allocated_capacity = *psVar20;
              name.field_2._8_8_ = plVar12[3];
            }
            else {
              name.field_2._M_allocated_capacity = *psVar20;
              name._M_dataplus._M_p = (pointer)*plVar12;
            }
            name._M_string_length = plVar12[1];
            *plVar12 = (long)psVar20;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
              operator_delete(vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                              _vptr_basic_ostream,
                              vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
            }
            if (frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
              operator_delete(frag.super_basic_ostream<char,_std::char_traits<char>_>.
                              _vptr_basic_ostream,
                              frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
              operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                              vertTemplate.m_template.field_2._M_allocated_capacity + 1);
            }
            if ((_Base_ptr *)params._M_t._M_impl._0_8_ != pp_Var31) {
              operator_delete((void *)params._M_t._M_impl._0_8_,
                              (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
            params._M_t._M_impl._0_8_ = pp_Var31;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&params,"Uniform array with ","");
            plVar12 = (long *)std::__cxx11::string::append((char *)&params);
            vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
            psVar20 = (size_type *)(plVar12 + 2);
            if ((size_type *)*plVar12 == psVar20) {
              vertTemplate.m_template.field_2._M_allocated_capacity = *psVar20;
              vertTemplate.m_template.field_2._8_8_ = plVar12[3];
            }
            else {
              vertTemplate.m_template.field_2._M_allocated_capacity = *psVar20;
              vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar12;
            }
            vertTemplate.m_template._M_string_length = plVar12[1];
            *plVar12 = (long)psVar20;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            plVar12 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
            frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                 (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
            pp_Var21 = (_func_int **)(plVar12 + 2);
            if ((_func_int **)*plVar12 == pp_Var21) {
              frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
              frag.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar12[3];
            }
            else {
              frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
              frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)*plVar12;
            }
            frag.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar12[1];
            *plVar12 = (long)pp_Var21;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            plVar12 = (long *)std::__cxx11::string::append((char *)&frag);
            vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                 (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
            pp_Var21 = (_func_int **)(plVar12 + 2);
            if ((_func_int **)*plVar12 == pp_Var21) {
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar12[3];
            }
            else {
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)*plVar12;
            }
            vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar12[1];
            *plVar12 = (long)pp_Var21;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            plVar12 = (long *)std::__cxx11::string::append((char *)&vtx);
            desc._M_dataplus._M_p = (pointer)&desc.field_2;
            psVar20 = (size_type *)(plVar12 + 2);
            if ((size_type *)*plVar12 == psVar20) {
              desc.field_2._M_allocated_capacity = *psVar20;
              desc.field_2._8_8_ = plVar12[3];
            }
            else {
              desc.field_2._M_allocated_capacity = *psVar20;
              desc._M_dataplus._M_p = (pointer)*plVar12;
            }
            desc._M_string_length = plVar12[1];
            *plVar12 = (long)psVar20;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
              operator_delete(vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                              _vptr_basic_ostream,
                              vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
            }
            if (frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
              operator_delete(frag.super_basic_ostream<char,_std::char_traits<char>_>.
                              _vptr_basic_ostream,
                              frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
              operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                              vertTemplate.m_template.field_2._M_allocated_capacity + 1);
            }
            if ((_Base_ptr *)params._M_t._M_impl._0_8_ != pp_Var31) {
              operator_delete((void *)params._M_t._M_impl._0_8_,
                              (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
            _Var6._M_p = name._M_dataplus._M_p;
            _Var5._M_p = desc._M_dataplus._M_p;
            pCVar1 = (this->super_TestCaseGroup).m_context;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
            DVar30 = (DataType)local_3d8;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
            poVar27 = (ostringstream *)&frag;
            if (lVar33 == 0) {
              poVar27 = (ostringstream *)&vtx;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&vtx,"attribute highp vec4 a_position;\n",0x21);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                       "attribute highp vec4 a_coords;\n",0x1f);
            if (lVar33 == 0) {
              lVar26 = 0x1e;
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "varying mediump vec4 v_color;\n",0x1e);
              pcVar11 = "varying mediump vec4 v_color;\n";
            }
            else {
              lVar26 = 0x1f;
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "varying mediump vec4 v_coords;\n",0x1f);
              pcVar11 = "varying mediump vec4 v_coords;\n";
              DVar30 = (DataType)local_3d8;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar11,lVar26);
            if ((uVar22 | 2) == 3) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar27,pcVar25,lVar24);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar27,"uniform ${PRECISION} ${VAR_TYPE} u_arr[${ARRAY_LEN}];\n",
                       0x36);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n",0xc);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"{\n",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                       "\tgl_Position = a_position;\n",0x1b);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n",0xc)
            ;
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"{\n",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar27,"\t${PRECISION} ${VAR_TYPE} res = ${VAR_TYPE}(0.0);\n",
                       0x32);
            if (uVar22 == 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar27,"\tres += u_arr[0];\n",0x12);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar27,"\tres += u_arr[1];\n",0x12);
              lVar26 = 0x12;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar27,"\tres += u_arr[2];\n",0x12);
              pcVar11 = "\tres += u_arr[3];\n";
            }
            else if (uVar22 == 1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar27,"\tres += u_arr[ui_zero];\n",0x18);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar27,"\tres += u_arr[ui_one];\n",0x17);
              lVar26 = 0x19;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar27,"\tres += u_arr[ui_two];\n",0x17);
              pcVar11 = "\tres += u_arr[ui_three];\n";
            }
            else {
              lVar26 = 0x13;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar27,pcVar18,lVar17);
              pcVar11 = "\t\tres += u_arr[i];\n";
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar27,pcVar11,lVar26);
            if (lVar33 == 0) {
              lVar26 = 0x19;
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "\tv_color = vec4(res${PADDING});\n",0x20);
              pcVar11 = "\tgl_FragColor = v_color;\n";
            }
            else {
              lVar26 = 0x25;
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "\tv_coords = a_coords;\n",0x16);
              pcVar11 = "\tgl_FragColor = vec4(res${PADDING});\n";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar11,lVar26);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"}\n",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"}\n",2);
            params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &params._M_t._M_impl.super__Rb_tree_header._M_header;
            params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(DVar30);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[9],_const_char_*,_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [9])0x1bc23a9,(char **)&fragTemplate);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_498._M_p != &local_488) {
              operator_delete(local_498._M_p,local_488._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
              operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                              vertTemplate.m_template.field_2._M_allocated_capacity + 1);
            }
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[10],_const_char_(&)[2],_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [10])"ARRAY_LEN",(char (*) [2])0x1c01ff7);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_498._M_p != &local_488) {
              operator_delete(local_498._M_p,local_488._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
              operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                              vertTemplate.m_template.field_2._M_allocated_capacity + 1);
            }
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [10])0x1cf2bdb,(char (*) [8])0x1c00dfd);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_498._M_p != &local_488) {
              operator_delete(local_498._M_p,local_488._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
              operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                              vertTemplate.m_template.field_2._M_allocated_capacity + 1);
            }
            if (DVar30 == TYPE_FLOAT_VEC3) {
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [6])0x1bbf031);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
            }
            else if (DVar30 == TYPE_FLOAT_VEC2) {
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [11])0x1bbf02c);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
            }
            else if (DVar30 == TYPE_FLOAT) {
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[8],_const_char_(&)[16],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [16])", 0.0, 0.0, 1.0");
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
            }
            else {
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [8])"PADDING",
                         (char (*) [1])(glcts::fixed_sample_locations_values + 1));
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_498._M_p != &local_488) {
              operator_delete(local_498._M_p,local_488._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
              operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                              vertTemplate.m_template.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&fragTemplate.m_template,vertexShaderSource._M_dataplus._M_p,
                       (allocator<char> *)&local_3f8);
            tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
              operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                              fragTemplate.m_template.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
              operator_delete(vertexShaderSource._M_dataplus._M_p,
                              vertexShaderSource.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vertexShaderSource,local_3f8._M_dataplus._M_p,&local_451);
            tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
              operator_delete(vertexShaderSource._M_dataplus._M_p,
                              vertexShaderSource.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
              operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1
                             );
            }
            tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
            tcu::StringTemplate::specialize(&local_3f8,&fragTemplate,&params);
            if (uVar7 < 4) {
              p_Var29 = (ShaderEvalFunc)(&PTR_evalArrayUniformFloat_02165ba0)[uVar7];
            }
            else {
              p_Var29 = (ShaderEvalFunc)0x0;
            }
            pSVar13 = (ShaderIndexingCase *)operator_new(0x130);
            bVar2 = lVar33 != 0;
            dVar3 = bVar2 + 3 + (uint)bVar2;
            if (uVar22 != 3) {
              dVar3 = (uint)bVar34;
            }
            ShaderIndexingCase::ShaderIndexingCase
                      (pSVar13,pCVar1,_Var6._M_p,_Var5._M_p,lVar33 == 0,DVar30,p_Var29,dVar3,
                       vertexShaderSource._M_dataplus._M_p,local_3f8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
              operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
              operator_delete(vertexShaderSource._M_dataplus._M_p,
                              vertexShaderSource.field_2._M_allocated_capacity + 1);
            }
            tcu::StringTemplate::~StringTemplate(&fragTemplate);
            tcu::StringTemplate::~StringTemplate(&vertTemplate);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~_Rb_tree(&params._M_t);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
            std::ios_base::~ios_base
                      ((ios_base *)
                       &frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
            std::ios_base::~ios_base
                      ((ios_base *)
                       &vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
            tcu::TestNode::addChild(pTVar10,(TestNode *)pSVar13);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)desc._M_dataplus._M_p != &desc.field_2) {
              operator_delete(desc._M_dataplus._M_p,desc.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)name._M_dataplus._M_p != &name.field_2) {
              operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
            }
            lVar33 = lVar33 + 4;
          } while (lVar33 == 4);
          uVar22 = uVar22 + 1;
        } while (uVar22 != 4);
        lVar23 = lVar23 + 1;
      } while (lVar23 != 4);
      pTVar10 = (TestNode *)operator_new(0x78);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar10,pCVar1->m_testCtx,"tmp_array",
                 "Temporary array access tests.");
      pTVar10->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215e3d0;
      pTVar10[1]._vptr_TestNode = (_func_int **)pCVar1;
      tcu::TestNode::addChild((TestNode *)this,pTVar10);
      lVar23 = 0;
      do {
        DVar30 = Performance::ShaderOperatorTests::init()::floatTypes[lVar23];
        lVar24 = 0;
        do {
          pcVar25 = "\tfor (int i = 0; i < ui_four; i++)\n";
          if (lVar24 == 2) {
            pcVar25 = "\tfor (int i = 0; i < 4; i++)\n";
          }
          lVar17 = 0x23;
          if (lVar24 == 2) {
            lVar17 = 0x1d;
          }
          lVar33 = 0;
          do {
            local_3d0 = CONCAT71(local_3d0._1_7_,lVar33 == 3 || lVar24 == 3);
            local_3d8 = CONCAT44(local_3d8._4_4_,(uint)(lVar33 == 1 || lVar24 == 1));
            pcVar18 = "\tfor (int i = 0; i < ui_four; i++)\n";
            if (lVar33 == 2) {
              pcVar18 = "\tfor (int i = 0; i < 4; i++)\n";
            }
            lVar26 = 0x23;
            if (lVar33 == 2) {
              lVar26 = 0x1d;
            }
            lVar32 = 0;
            do {
              glu::getShaderTypeName
                        (*(ShaderType *)
                          ((long)UniformCase::randomFeatures(unsigned_int)::arrayUsageChoices +
                          lVar32));
              pcVar11 = glu::getDataTypeName(DVar30);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vertexShaderSource,pcVar11,(allocator<char> *)&local_3f8);
              plVar12 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar20 = (size_type *)(plVar12 + 2);
              if ((size_type *)*plVar12 == psVar20) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar20;
                fragTemplate.m_template.field_2._8_8_ = plVar12[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar20;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar12;
              }
              fragTemplate.m_template._M_string_length = plVar12[1];
              *plVar12 = (long)psVar20;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&fragTemplate);
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar19 = plVar12 + 2;
              if ((long *)*plVar12 == plVar19) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar19;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar12[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar19;
                params._M_t._M_impl._0_8_ = (long *)*plVar12;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar12[1];
              *plVar12 = (long)plVar19;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar20 = (size_type *)(plVar12 + 2);
              if ((size_type *)*plVar12 == psVar20) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar20;
                vertTemplate.m_template.field_2._8_8_ = plVar12[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar20;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar12;
              }
              vertTemplate.m_template._M_string_length = plVar12[1];
              *plVar12 = (long)psVar20;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
              frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10
              ;
              pp_Var21 = (_func_int **)(plVar12 + 2);
              if ((_func_int **)*plVar12 == pp_Var21) {
                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
                frag.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar12[3];
              }
              else {
                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
                frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)*plVar12;
              }
              frag.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar12[1];
              *plVar12 = (long)pp_Var21;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&frag);
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
              pp_Var21 = (_func_int **)(plVar12 + 2);
              if ((_func_int **)*plVar12 == pp_Var21) {
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar12[3];
              }
              else {
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)*plVar12;
              }
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar12[1];
              *plVar12 = (long)pp_Var21;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&vtx);
              name._M_dataplus._M_p = (pointer)&name.field_2;
              psVar20 = (size_type *)(plVar12 + 2);
              if ((size_type *)*plVar12 == psVar20) {
                name.field_2._M_allocated_capacity = *psVar20;
                name.field_2._8_8_ = plVar12[3];
              }
              else {
                name.field_2._M_allocated_capacity = *psVar20;
                name._M_dataplus._M_p = (pointer)*plVar12;
              }
              name._M_string_length = plVar12[1];
              *plVar12 = (long)psVar20;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
              {
                operator_delete(vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if (frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
              {
                operator_delete(frag.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              vertexShaderSource._M_dataplus._M_p = (pointer)&vertexShaderSource.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&vertexShaderSource,"Temporary array with ","");
              plVar12 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar20 = (size_type *)(plVar12 + 2);
              if ((size_type *)*plVar12 == psVar20) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar20;
                fragTemplate.m_template.field_2._8_8_ = plVar12[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar20;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar12;
              }
              fragTemplate.m_template._M_string_length = plVar12[1];
              *plVar12 = (long)psVar20;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&fragTemplate);
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar19 = plVar12 + 2;
              if ((long *)*plVar12 == plVar19) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar19;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar12[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar19;
                params._M_t._M_impl._0_8_ = (long *)*plVar12;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar12[1];
              *plVar12 = (long)plVar19;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar20 = (size_type *)(plVar12 + 2);
              if ((size_type *)*plVar12 == psVar20) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar20;
                vertTemplate.m_template.field_2._8_8_ = plVar12[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar20;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar12;
              }
              vertTemplate.m_template._M_string_length = plVar12[1];
              *plVar12 = (long)psVar20;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
              frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10
              ;
              pp_Var21 = (_func_int **)(plVar12 + 2);
              if ((_func_int **)*plVar12 == pp_Var21) {
                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
                frag.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar12[3];
              }
              else {
                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
                frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)*plVar12;
              }
              frag.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar12[1];
              *plVar12 = (long)pp_Var21;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&frag);
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
              pp_Var21 = (_func_int **)(plVar12 + 2);
              if ((_func_int **)*plVar12 == pp_Var21) {
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar12[3];
              }
              else {
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)*plVar12;
              }
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar12[1];
              *plVar12 = (long)pp_Var21;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&vtx);
              desc._M_dataplus._M_p = (pointer)&desc.field_2;
              psVar20 = (size_type *)(plVar12 + 2);
              if ((size_type *)*plVar12 == psVar20) {
                desc.field_2._M_allocated_capacity = *psVar20;
                desc.field_2._8_8_ = plVar12[3];
              }
              else {
                desc.field_2._M_allocated_capacity = *psVar20;
                desc._M_dataplus._M_p = (pointer)*plVar12;
              }
              desc._M_string_length = plVar12[1];
              *plVar12 = (long)psVar20;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
              {
                operator_delete(vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if (frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
              {
                operator_delete(frag.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              _Var6._M_p = name._M_dataplus._M_p;
              _Var5._M_p = desc._M_dataplus._M_p;
              pCVar1 = (this->super_TestCaseGroup).m_context;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
              poVar27 = (ostringstream *)&frag;
              if (lVar32 == 0) {
                poVar27 = (ostringstream *)&vtx;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"attribute highp vec4 a_position;\n",0x21);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "attribute highp vec4 a_coords;\n",0x1f);
              if (lVar32 == 0) {
                lVar28 = 0x1e;
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "varying mediump vec4 v_color;\n",0x1e);
                pcVar11 = "varying mediump vec4 v_color;\n";
              }
              else {
                lVar28 = 0x1f;
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "varying mediump vec4 v_coords;\n",0x1f);
                pcVar11 = "varying mediump vec4 v_coords;\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar11,lVar28);
              if ((deUint32)local_3d8 != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar27,
                           "uniform mediump int ui_zero, ui_one, ui_two, ui_three;\n",0x37);
              }
              if ((char)local_3d0 != '\0') {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar27,"uniform mediump int ui_four;\n",0x1d);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n",0xc
                        );
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"{\n",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "\tgl_Position = a_position;\n",0x1b);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n",
                         0xc);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"{\n",2);
              pcVar11 = "\t${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(v_coords);\n";
              if (lVar32 == 0) {
                pcVar11 = "\t${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(a_coords);\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar27,pcVar11,0x3a);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar27,"\t${PRECISION} ${VAR_TYPE} arr[${ARRAY_LEN}];\n",0x2d);
              if (lVar24 == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar27,"\tarr[0] = ${VAR_TYPE}(coords);\n",0x1f);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar27,"\tarr[1] = ${VAR_TYPE}(coords) * 0.5;\n",0x25);
                lVar28 = 0x27;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar27,"\tarr[2] = ${VAR_TYPE}(coords) * 0.25;\n",0x26);
                pcVar11 = "\tarr[3] = ${VAR_TYPE}(coords) * 0.125;\n";
              }
              else if (lVar24 == 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar27,"\tarr[ui_zero]  = ${VAR_TYPE}(coords);\n",0x26);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar27,"\tarr[ui_one]   = ${VAR_TYPE}(coords) * 0.5;\n",0x2c)
                ;
                lVar28 = 0x2e;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar27,"\tarr[ui_two]   = ${VAR_TYPE}(coords) * 0.25;\n",0x2d
                          );
                pcVar11 = "\tarr[ui_three] = ${VAR_TYPE}(coords) * 0.125;\n";
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar27,pcVar25,lVar17);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar27,"\t{\n",3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar27,"\t\tarr[i] = ${VAR_TYPE}(coords);\n",0x20);
                lVar28 = 3;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar27,"\t\tcoords = coords * 0.5;\n",0x19);
                pcVar11 = "\t}\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar27,pcVar11,lVar28);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar27,"\t${PRECISION} ${VAR_TYPE} res = ${VAR_TYPE}(0.0);\n",
                         0x32);
              if (lVar33 == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar27,"\tres += arr[0];\n",0x10);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar27,"\tres += arr[1];\n",0x10);
                lVar28 = 0x10;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar27,"\tres += arr[2];\n",0x10);
                pcVar11 = "\tres += arr[3];\n";
              }
              else if (lVar33 == 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar27,"\tres += arr[ui_zero];\n",0x16);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar27,"\tres += arr[ui_one];\n",0x15);
                lVar28 = 0x17;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar27,"\tres += arr[ui_two];\n",0x15);
                pcVar11 = "\tres += arr[ui_three];\n";
              }
              else {
                lVar28 = 0x11;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar27,pcVar18,lVar26);
                pcVar11 = "\t\tres += arr[i];\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar27,pcVar11,lVar28);
              if (lVar32 == 0) {
                lVar28 = 0x19;
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "\tv_color = vec4(res${PADDING});\n",0x20);
                pcVar11 = "\tgl_FragColor = v_color;\n";
              }
              else {
                lVar28 = 0x25;
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "\tv_coords = a_coords;\n",0x16);
                pcVar11 = "\tgl_FragColor = vec4(res${PADDING});\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar11,lVar28);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"}\n",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"}\n",2);
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header;
              params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(DVar30);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[9],_const_char_*,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [9])0x1bc23a9,(char **)&fragTemplate);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_498._M_p != &local_488) {
                operator_delete(local_498._M_p,local_488._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[10],_const_char_(&)[2],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [10])"ARRAY_LEN",(char (*) [2])0x1c01ff7);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_498._M_p != &local_488) {
                operator_delete(local_498._M_p,local_488._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [10])0x1cf2bdb,(char (*) [8])0x1c00dfd);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_498._M_p != &local_488) {
                operator_delete(local_498._M_p,local_488._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if (DVar30 == TYPE_FLOAT_VEC3) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [6])0x1bbf031);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              else if (DVar30 == TYPE_FLOAT_VEC2) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [11])0x1bbf02c);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              else if (DVar30 == TYPE_FLOAT) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[16],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [16])", 0.0, 0.0, 1.0"
                          );
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              else {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",
                           (char (*) [1])(glcts::fixed_sample_locations_values + 1));
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_498._M_p != &local_488) {
                operator_delete(local_498._M_p,local_488._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&fragTemplate.m_template,vertexShaderSource._M_dataplus._M_p,
                         (allocator<char> *)&local_3f8);
              tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vertexShaderSource,local_3f8._M_dataplus._M_p,&local_451);
              tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                operator_delete(local_3f8._M_dataplus._M_p,
                                local_3f8.field_2._M_allocated_capacity + 1);
              }
              tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
              tcu::StringTemplate::specialize(&local_3f8,&fragTemplate,&params);
              if (DVar30 - TYPE_FLOAT < 4) {
                p_Var29 = (ShaderEvalFunc)(&PTR_evalArrayCoordsFloat_02165bc0)[DVar30 - TYPE_FLOAT];
              }
              else {
                p_Var29 = (ShaderEvalFunc)0x0;
              }
              pSVar13 = (ShaderIndexingCase *)operator_new(0x130);
              dVar3 = (uint)(lVar32 != 0) * 2 + 3;
              if ((char)local_3d0 == '\0') {
                dVar3 = (deUint32)local_3d8;
              }
              ShaderIndexingCase::ShaderIndexingCase
                        (pSVar13,pCVar1,_Var6._M_p,_Var5._M_p,lVar32 == 0,DVar30,p_Var29,dVar3,
                         vertexShaderSource._M_dataplus._M_p,local_3f8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                operator_delete(local_3f8._M_dataplus._M_p,
                                local_3f8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              tcu::StringTemplate::~StringTemplate(&fragTemplate);
              tcu::StringTemplate::~StringTemplate(&vertTemplate);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(&params._M_t);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
              std::ios_base::~ios_base
                        ((ios_base *)
                         &frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
              std::ios_base::~ios_base
                        ((ios_base *)
                         &vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
              tcu::TestNode::addChild(pTVar10,(TestNode *)pSVar13);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)desc._M_dataplus._M_p != &desc.field_2) {
                operator_delete(desc._M_dataplus._M_p,desc.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)name._M_dataplus._M_p != &name.field_2) {
                operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
              }
              lVar32 = lVar32 + 4;
            } while (lVar32 == 4);
            lVar33 = lVar33 + 1;
          } while (lVar33 != 4);
          lVar24 = lVar24 + 1;
        } while (lVar24 != 4);
        lVar23 = lVar23 + 1;
      } while (lVar23 != 4);
      pTVar10 = (TestNode *)operator_new(0x78);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar10,pCVar1->m_testCtx,"vector_subscript",
                 "Vector subscript indexing.");
      pTVar10->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215e3d0;
      pTVar10[1]._vptr_TestNode = (_func_int **)pCVar1;
      tcu::TestNode::addChild((TestNode *)this,pTVar10);
      lVar23 = 0;
      do {
        DVar30 = init::s_vectorTypes[lVar23];
        lVar24 = 0;
        do {
          lVar17 = 0;
          do {
            local_3d8 = (&getVectorAccessTypeName(deqp::gles2::Functional::VectorAccessType)::
                          s_names)[lVar17];
            local_3d0 = CONCAT44(local_3d0._4_4_,(uint)(lVar17 == 3 || lVar24 == 3));
            lVar33 = 0;
            do {
              glu::getShaderTypeName
                        (*(ShaderType *)
                          ((long)UniformCase::randomFeatures(unsigned_int)::arrayUsageChoices +
                          lVar33));
              pcVar25 = glu::getDataTypeName(DVar30);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vertexShaderSource,pcVar25,(allocator<char> *)&local_3f8);
              plVar12 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar20 = (size_type *)(plVar12 + 2);
              if ((size_type *)*plVar12 == psVar20) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar20;
                fragTemplate.m_template.field_2._8_8_ = plVar12[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar20;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar12;
              }
              fragTemplate.m_template._M_string_length = plVar12[1];
              *plVar12 = (long)psVar20;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&fragTemplate);
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar19 = plVar12 + 2;
              if ((long *)*plVar12 == plVar19) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar19;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar12[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar19;
                params._M_t._M_impl._0_8_ = (long *)*plVar12;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar12[1];
              *plVar12 = (long)plVar19;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar20 = (size_type *)(plVar12 + 2);
              if ((size_type *)*plVar12 == psVar20) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar20;
                vertTemplate.m_template.field_2._8_8_ = plVar12[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar20;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar12;
              }
              vertTemplate.m_template._M_string_length = plVar12[1];
              *plVar12 = (long)psVar20;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
              frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10
              ;
              pp_Var21 = (_func_int **)(plVar12 + 2);
              if ((_func_int **)*plVar12 == pp_Var21) {
                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
                frag.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar12[3];
              }
              else {
                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
                frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)*plVar12;
              }
              frag.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar12[1];
              *plVar12 = (long)pp_Var21;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&frag);
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
              pp_Var21 = (_func_int **)(plVar12 + 2);
              if ((_func_int **)*plVar12 == pp_Var21) {
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar12[3];
              }
              else {
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)*plVar12;
              }
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar12[1];
              *plVar12 = (long)pp_Var21;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&vtx);
              name._M_dataplus._M_p = (pointer)&name.field_2;
              psVar20 = (size_type *)(plVar12 + 2);
              if ((size_type *)*plVar12 == psVar20) {
                name.field_2._M_allocated_capacity = *psVar20;
                name.field_2._8_8_ = plVar12[3];
              }
              else {
                name.field_2._M_allocated_capacity = *psVar20;
                name._M_dataplus._M_p = (pointer)*plVar12;
              }
              name._M_string_length = plVar12[1];
              *plVar12 = (long)psVar20;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
              {
                operator_delete(vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if (frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
              {
                operator_delete(frag.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              vertexShaderSource._M_dataplus._M_p = (pointer)&vertexShaderSource.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&vertexShaderSource,"Vector subscript access with ","");
              plVar12 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar20 = (size_type *)(plVar12 + 2);
              if ((size_type *)*plVar12 == psVar20) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar20;
                fragTemplate.m_template.field_2._8_8_ = plVar12[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar20;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar12;
              }
              fragTemplate.m_template._M_string_length = plVar12[1];
              *plVar12 = (long)psVar20;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&fragTemplate);
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar19 = plVar12 + 2;
              if ((long *)*plVar12 == plVar19) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar19;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar12[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar19;
                params._M_t._M_impl._0_8_ = (long *)*plVar12;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar12[1];
              *plVar12 = (long)plVar19;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar20 = (size_type *)(plVar12 + 2);
              if ((size_type *)*plVar12 == psVar20) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar20;
                vertTemplate.m_template.field_2._8_8_ = plVar12[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar20;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar12;
              }
              vertTemplate.m_template._M_string_length = plVar12[1];
              *plVar12 = (long)psVar20;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
              frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10
              ;
              pp_Var21 = (_func_int **)(plVar12 + 2);
              if ((_func_int **)*plVar12 == pp_Var21) {
                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
                frag.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar12[3];
              }
              else {
                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
                frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)*plVar12;
              }
              frag.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar12[1];
              *plVar12 = (long)pp_Var21;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&frag);
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
              pp_Var21 = (_func_int **)(plVar12 + 2);
              if ((_func_int **)*plVar12 == pp_Var21) {
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar12[3];
              }
              else {
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)*plVar12;
              }
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar12[1];
              *plVar12 = (long)pp_Var21;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&vtx);
              desc._M_dataplus._M_p = (pointer)&desc.field_2;
              psVar20 = (size_type *)(plVar12 + 2);
              if ((size_type *)*plVar12 == psVar20) {
                desc.field_2._M_allocated_capacity = *psVar20;
                desc.field_2._8_8_ = plVar12[3];
              }
              else {
                desc.field_2._M_allocated_capacity = *psVar20;
                desc._M_dataplus._M_p = (pointer)*plVar12;
              }
              desc._M_string_length = plVar12[1];
              *plVar12 = (long)psVar20;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
              {
                operator_delete(vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if (frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
              {
                operator_delete(frag.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              _Var6._M_p = name._M_dataplus._M_p;
              _Var5._M_p = desc._M_dataplus._M_p;
              pCVar1 = (this->super_TestCaseGroup).m_context;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
              poVar27 = (ostringstream *)&frag;
              if (lVar33 == 0) {
                poVar27 = (ostringstream *)&vtx;
              }
              iVar8 = glu::getDataTypeScalarSize(DVar30);
              pcVar25 = deqp::gls::getIntUniformName(iVar8);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "attribute highp vec4 a_position;\n",0x21);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "attribute highp vec4 a_coords;\n",0x1f);
              if (lVar33 == 0) {
                lVar26 = 0x1e;
                pcVar18 = "varying mediump vec3 v_color;\n";
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "varying mediump vec3 v_color;\n",0x1e);
              }
              else {
                lVar26 = 0x1f;
                pcVar18 = "varying mediump vec4 v_coords;\n";
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "varying mediump vec4 v_coords;\n",0x1f);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar18,lVar26);
              if ((deUint32)local_3d0 != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar27,"uniform mediump int ui_zero",0x1b);
                if (1 < iVar8) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar27,", ui_one",8);
                }
                if (2 < iVar8) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar27,", ui_two",8);
                }
                if (3 < iVar8) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar27,", ui_three",10);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar27,";\n",2);
              }
              iVar4 = (int)poVar27;
              if (lVar17 == 5 || lVar24 == 5) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar27,"uniform mediump int ",0x14);
                if (pcVar25 == (char *)0x0) {
                  std::ios::clear(iVar4 + (int)*(undefined8 *)(*(long *)poVar27 + -0x18));
                }
                else {
                  sVar14 = strlen(pcVar25);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar27,pcVar25,sVar14);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar27,";\n",2);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n",0xc
                        );
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"{\n",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "\tgl_Position = a_position;\n",0x1b);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n",
                         0xc);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"{\n",2);
              pcVar18 = "\t${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(v_coords);\n";
              if (lVar33 == 0) {
                pcVar18 = "\t${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(a_coords);\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar27,pcVar18,0x3a);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar27,"\t${PRECISION} ${VAR_TYPE} tmp;\n",0x1f);
              iVar9 = (int)lVar24;
              if (iVar9 == 0) {
                lVar26 = 0x43;
                pcVar18 = "\ttmp = coords.${SWIZZLE} * vec4(1.0, 0.5, 0.25, 0.125).${SWIZZLE};\n";
LAB_00ef2d95:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar27,pcVar18,lVar26);
              }
              else {
                if (iVar9 == 2) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar27,"\ttmp[0] = coords.x;\n",0x14);
                  if (1 < iVar8) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar27,"\ttmp[1] = coords.y * 0.5;\n",0x1a);
                  }
                  if (2 < iVar8) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar27,"\ttmp[2] = coords.z * 0.25;\n",0x1b);
                  }
                  lVar26 = 0x1c;
                  pcVar18 = "\ttmp[3] = coords.w * 0.125;\n";
                }
                else if (iVar9 == 1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar27,"\ttmp.x = coords.x;\n",0x13);
                  if (1 < iVar8) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar27,"\ttmp.y = coords.y * 0.5;\n",0x19);
                  }
                  if (2 < iVar8) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar27,"\ttmp.z = coords.z * 0.25;\n",0x1a);
                  }
                  lVar26 = 0x1b;
                  pcVar18 = "\ttmp.w = coords.w * 0.125;\n";
                }
                else {
                  if (lVar24 != 3) {
                    if (lVar24 == 4) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)poVar27,"\tfor (int i = 0; i < ",0x15);
                      poVar15 = (ostringstream *)std::ostream::operator<<(poVar27,iVar8);
                    }
                    else {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)poVar27,"\tfor (int i = 0; i < ",0x15);
                      poVar15 = poVar27;
                      if (pcVar25 == (char *)0x0) {
                        std::ios::clear(iVar4 + (int)*(undefined8 *)(*(long *)poVar27 + -0x18));
                      }
                      else {
                        sVar14 = strlen(pcVar25);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)poVar27,pcVar25,sVar14);
                      }
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar15,"; i++)\n",7);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar27,"\t{\n",3)
                    ;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar27,"\t\ttmp[i] = coords.x;\n",0x15);
                    lVar26 = 3;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar27,"\t\tcoords = coords.${ROT_SWIZZLE} * 0.5;\n",0x28
                              );
                    pcVar18 = "\t}\n";
                    goto LAB_00ef2d95;
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar27,"\ttmp[ui_zero]  = coords.x;\n",0x1b);
                  if (1 < iVar8) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar27,"\ttmp[ui_one]   = coords.y * 0.5;\n",0x21);
                  }
                  if (2 < iVar8) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar27,"\ttmp[ui_two]   = coords.z * 0.25;\n",0x22);
                  }
                  lVar26 = 0x23;
                  pcVar18 = "\ttmp[ui_three] = coords.w * 0.125;\n";
                }
                if (3 < iVar8) goto LAB_00ef2d95;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar27,"\t${PRECISION} float res = 0.0;\n",0x1f);
              iVar9 = (int)lVar17;
              if (iVar9 == 0) {
                lVar26 = 0x23;
                pcVar25 = "\tres = dot(tmp, ${VAR_TYPE}(1.0));\n";
LAB_00ef2f89:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar27,pcVar25,lVar26);
              }
              else {
                if (iVar9 == 2) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar27,"\tres += tmp[0];\n",0x10);
                  if (1 < iVar8) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar27,"\tres += tmp[1];\n",0x10);
                  }
                  if (2 < iVar8) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar27,"\tres += tmp[2];\n",0x10);
                  }
                  lVar26 = 0x10;
                  pcVar25 = "\tres += tmp[3];\n";
                }
                else if (iVar9 == 1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar27,"\tres += tmp.x;\n",0xf);
                  if (1 < iVar8) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar27,"\tres += tmp.y;\n",0xf);
                  }
                  if (2 < iVar8) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar27,"\tres += tmp.z;\n",0xf);
                  }
                  lVar26 = 0xf;
                  pcVar25 = "\tres += tmp.w;\n";
                }
                else {
                  if (lVar17 != 3) {
                    if (lVar17 == 4) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)poVar27,"\tfor (int i = 0; i < ",0x15);
                      poVar15 = (ostringstream *)std::ostream::operator<<(poVar27,iVar8);
                    }
                    else {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)poVar27,"\tfor (int i = 0; i < ",0x15);
                      poVar15 = poVar27;
                      if (pcVar25 == (char *)0x0) {
                        std::ios::clear(iVar4 + (int)*(undefined8 *)(*(long *)poVar27 + -0x18));
                      }
                      else {
                        sVar14 = strlen(pcVar25);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)poVar27,pcVar25,sVar14);
                      }
                    }
                    lVar26 = 0x11;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar15,"; i++)\n",7);
                    pcVar25 = "\t\tres += tmp[i];\n";
                    goto LAB_00ef2f89;
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar27,"\tres += tmp[ui_zero];\n",0x16);
                  if (1 < iVar8) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar27,"\tres += tmp[ui_one];\n",0x15);
                  }
                  if (2 < iVar8) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar27,"\tres += tmp[ui_two];\n",0x15);
                  }
                  lVar26 = 0x17;
                  pcVar25 = "\tres += tmp[ui_three];\n";
                }
                if (3 < iVar8) goto LAB_00ef2f89;
              }
              if (lVar33 == 0) {
                lVar26 = 0x24;
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "\tv_color = vec3(res);\n",0x16);
                pcVar25 = "\tgl_FragColor = vec4(v_color, 1.0);\n";
              }
              else {
                lVar26 = 0x26;
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "\tv_coords = a_coords;\n",0x16);
                pcVar25 = "\tgl_FragColor = vec4(vec3(res), 1.0);\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar25,lVar26);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"}\n",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"}\n",2);
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header;
              params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(DVar30);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[9],_const_char_*,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [9])0x1bc23a9,(char **)&fragTemplate);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_498._M_p != &local_488) {
                operator_delete(local_498._M_p,local_488._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [10])0x1cf2bdb,(char (*) [8])0x1c00dfd);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_498._M_p != &local_488) {
                operator_delete(local_498._M_p,local_488._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[8],_const_char_*&,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [8])0x1ae46e2,
                         (char **)(createVectorSubscriptCase(deqp::gles2::Context&,char_const*,char_const*,bool,glu::DataType,deqp::gles2::Functional::VectorAccessType,deqp::gles2::Functional::VectorAccessType)
                                   ::s_swizzles + (long)iVar8 * 8));
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_498._M_p != &local_488) {
                operator_delete(local_498._M_p,local_488._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[12],_const_char_*&,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [12])"ROT_SWIZZLE",
                         (char **)(createVectorSubscriptCase(deqp::gles2::Context&,char_const*,char_const*,bool,glu::DataType,deqp::gles2::Functional::VectorAccessType,deqp::gles2::Functional::VectorAccessType)
                                   ::s_rotSwizzles + (long)iVar8 * 8));
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_498._M_p != &local_488) {
                operator_delete(local_498._M_p,local_488._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&fragTemplate.m_template,vertexShaderSource._M_dataplus._M_p,
                         (allocator<char> *)&local_3f8);
              tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vertexShaderSource,local_3f8._M_dataplus._M_p,&local_451);
              tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                operator_delete(local_3f8._M_dataplus._M_p,
                                local_3f8.field_2._M_allocated_capacity + 1);
              }
              tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
              tcu::StringTemplate::specialize(&local_3f8,&fragTemplate,&params);
              if (DVar30 - TYPE_FLOAT_VEC2 < 3) {
                p_Var29 = (ShaderEvalFunc)
                          (&PTR_evalSubscriptVec2_02165be0)[DVar30 - TYPE_FLOAT_VEC2];
              }
              else {
                p_Var29 = (ShaderEvalFunc)0x0;
              }
              pSVar13 = (ShaderIndexingCase *)operator_new(0x130);
              dVar3 = (uint)(lVar33 != 0) * 2 + 3;
              if (lVar17 != 5 && lVar24 != 5) {
                dVar3 = (deUint32)local_3d0;
              }
              ShaderIndexingCase::ShaderIndexingCase
                        (pSVar13,pCVar1,_Var6._M_p,_Var5._M_p,lVar33 == 0,DVar30,p_Var29,dVar3,
                         vertexShaderSource._M_dataplus._M_p,local_3f8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                operator_delete(local_3f8._M_dataplus._M_p,
                                local_3f8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              tcu::StringTemplate::~StringTemplate(&fragTemplate);
              tcu::StringTemplate::~StringTemplate(&vertTemplate);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(&params._M_t);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
              std::ios_base::~ios_base
                        ((ios_base *)
                         &frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
              std::ios_base::~ios_base
                        ((ios_base *)
                         &vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
              tcu::TestNode::addChild(pTVar10,(TestNode *)pSVar13);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)desc._M_dataplus._M_p != &desc.field_2) {
                operator_delete(desc._M_dataplus._M_p,desc.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)name._M_dataplus._M_p != &name.field_2) {
                operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
              }
              lVar33 = lVar33 + 4;
            } while (lVar33 == 4);
            lVar17 = lVar17 + 1;
          } while (lVar17 != 6);
          lVar24 = lVar24 + 1;
        } while (lVar24 != 6);
        lVar23 = lVar23 + 1;
      } while (lVar23 != 3);
      pTVar10 = (TestNode *)operator_new(0x78);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar10,pCVar1->m_testCtx,"matrix_subscript",
                 "Matrix subscript indexing.");
      pTVar10->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215e3d0;
      pTVar10[1]._vptr_TestNode = (_func_int **)pCVar1;
      tcu::TestNode::addChild((TestNode *)this,pTVar10);
      local_348 = 0;
      do {
        DVar30 = init::s_matrixTypes[local_348];
        lVar23 = 0;
        do {
          lVar24 = 0;
          do {
            local_3d8 = (&getIndexAccessTypeName(deqp::gles2::Functional::IndexAccessType)::s_names)
                        [lVar24];
            local_3d0 = CONCAT44(local_3d0._4_4_,(uint)(lVar24 == 1 || lVar23 == 1));
            lVar17 = 0;
            do {
              glu::getShaderTypeName
                        (*(ShaderType *)
                          ((long)UniformCase::randomFeatures(unsigned_int)::arrayUsageChoices +
                          lVar17));
              pcVar25 = glu::getDataTypeName(DVar30);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vertexShaderSource,pcVar25,(allocator<char> *)&local_3f8);
              plVar12 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar20 = (size_type *)(plVar12 + 2);
              if ((size_type *)*plVar12 == psVar20) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar20;
                fragTemplate.m_template.field_2._8_8_ = plVar12[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar20;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar12;
              }
              fragTemplate.m_template._M_string_length = plVar12[1];
              *plVar12 = (long)psVar20;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&fragTemplate);
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar19 = plVar12 + 2;
              if ((long *)*plVar12 == plVar19) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar19;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar12[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar19;
                params._M_t._M_impl._0_8_ = (long *)*plVar12;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar12[1];
              *plVar12 = (long)plVar19;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar20 = (size_type *)(plVar12 + 2);
              if ((size_type *)*plVar12 == psVar20) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar20;
                vertTemplate.m_template.field_2._8_8_ = plVar12[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar20;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar12;
              }
              vertTemplate.m_template._M_string_length = plVar12[1];
              *plVar12 = (long)psVar20;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
              frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10
              ;
              pp_Var21 = (_func_int **)(plVar12 + 2);
              if ((_func_int **)*plVar12 == pp_Var21) {
                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
                frag.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar12[3];
              }
              else {
                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
                frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)*plVar12;
              }
              frag.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar12[1];
              *plVar12 = (long)pp_Var21;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&frag);
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
              pp_Var21 = (_func_int **)(plVar12 + 2);
              if ((_func_int **)*plVar12 == pp_Var21) {
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar12[3];
              }
              else {
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)*plVar12;
              }
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar12[1];
              *plVar12 = (long)pp_Var21;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&vtx);
              name._M_dataplus._M_p = (pointer)&name.field_2;
              psVar20 = (size_type *)(plVar12 + 2);
              if ((size_type *)*plVar12 == psVar20) {
                name.field_2._M_allocated_capacity = *psVar20;
                name.field_2._8_8_ = plVar12[3];
              }
              else {
                name.field_2._M_allocated_capacity = *psVar20;
                name._M_dataplus._M_p = (pointer)*plVar12;
              }
              name._M_string_length = plVar12[1];
              *plVar12 = (long)psVar20;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
              {
                operator_delete(vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if (frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
              {
                operator_delete(frag.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              vertexShaderSource._M_dataplus._M_p = (pointer)&vertexShaderSource.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&vertexShaderSource,"Vector subscript access with ","");
              plVar12 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar20 = (size_type *)(plVar12 + 2);
              if ((size_type *)*plVar12 == psVar20) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar20;
                fragTemplate.m_template.field_2._8_8_ = plVar12[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar20;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar12;
              }
              fragTemplate.m_template._M_string_length = plVar12[1];
              *plVar12 = (long)psVar20;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&fragTemplate);
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar19 = plVar12 + 2;
              if ((long *)*plVar12 == plVar19) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar19;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar12[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar19;
                params._M_t._M_impl._0_8_ = (long *)*plVar12;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar12[1];
              *plVar12 = (long)plVar19;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar20 = (size_type *)(plVar12 + 2);
              if ((size_type *)*plVar12 == psVar20) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar20;
                vertTemplate.m_template.field_2._8_8_ = plVar12[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar20;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar12;
              }
              vertTemplate.m_template._M_string_length = plVar12[1];
              *plVar12 = (long)psVar20;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
              frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10
              ;
              pp_Var21 = (_func_int **)(plVar12 + 2);
              if ((_func_int **)*plVar12 == pp_Var21) {
                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
                frag.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar12[3];
              }
              else {
                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
                frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)*plVar12;
              }
              frag.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar12[1];
              *plVar12 = (long)pp_Var21;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&frag);
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
              pp_Var21 = (_func_int **)(plVar12 + 2);
              if ((_func_int **)*plVar12 == pp_Var21) {
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar12[3];
              }
              else {
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var21;
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)*plVar12;
              }
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar12[1];
              *plVar12 = (long)pp_Var21;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&vtx);
              desc._M_dataplus._M_p = (pointer)&desc.field_2;
              psVar20 = (size_type *)(plVar12 + 2);
              if ((size_type *)*plVar12 == psVar20) {
                desc.field_2._M_allocated_capacity = *psVar20;
                desc.field_2._8_8_ = plVar12[3];
              }
              else {
                desc.field_2._M_allocated_capacity = *psVar20;
                desc._M_dataplus._M_p = (pointer)*plVar12;
              }
              desc._M_string_length = plVar12[1];
              *plVar12 = (long)psVar20;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
              {
                operator_delete(vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if (frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
              {
                operator_delete(frag.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              _Var6._M_p = name._M_dataplus._M_p;
              _Var5._M_p = desc._M_dataplus._M_p;
              pCVar1 = (this->super_TestCaseGroup).m_context;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
              poVar27 = (ostringstream *)&frag;
              if (lVar17 == 0) {
                poVar27 = (ostringstream *)&vtx;
              }
              iVar8 = glu::getDataTypeMatrixNumRows(DVar30);
              pcVar25 = deqp::gls::getIntUniformName(iVar8);
              dataType = glu::getDataTypeFloatVec(iVar8);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "attribute highp vec4 a_position;\n",0x21);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "attribute highp vec4 a_coords;\n",0x1f);
              if (lVar17 == 0) {
                lVar33 = 0x1e;
                pcVar18 = "varying mediump vec4 v_color;\n";
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "varying mediump vec4 v_color;\n",0x1e);
              }
              else {
                lVar33 = 0x1f;
                pcVar18 = "varying mediump vec4 v_coords;\n";
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "varying mediump vec4 v_coords;\n",0x1f);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar18,lVar33);
              if ((deUint32)local_3d0 != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar27,"uniform mediump int ui_zero",0x1b);
                if (1 < iVar8) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar27,", ui_one",8);
                }
                if (2 < iVar8) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar27,", ui_two",8);
                }
                if (3 < iVar8) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar27,", ui_three",10);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar27,";\n",2);
              }
              iVar4 = (int)poVar27;
              if (lVar24 == 3 || lVar23 == 3) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar27,"uniform mediump int ",0x14);
                if (pcVar25 == (char *)0x0) {
                  std::ios::clear(iVar4 + (int)*(undefined8 *)(*(long *)poVar27 + -0x18));
                }
                else {
                  sVar14 = strlen(pcVar25);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar27,pcVar25,sVar14);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar27,";\n",2);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n",0xc
                        );
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"{\n",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "\tgl_Position = a_position;\n",0x1b);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n",
                         0xc);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"{\n",2);
              pcVar18 = "\t${PRECISION} vec4 coords = v_coords;\n";
              if (lVar17 == 0) {
                pcVar18 = "\t${PRECISION} vec4 coords = a_coords;\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar27,pcVar18,0x26);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar27,"\t${PRECISION} ${MAT_TYPE} tmp;\n",0x1f);
              if (lVar23 == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar27,"\ttmp[0] = ${VEC_TYPE}(coords);\n",0x1f);
                if (1 < iVar8) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar27,"\ttmp[1] = ${VEC_TYPE}(coords.yzwx) * 0.5;\n",0x2a)
                  ;
                }
                if (2 < iVar8) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar27,"\ttmp[2] = ${VEC_TYPE}(coords.zwxy) * 0.25;\n",0x2b
                            );
                }
                lVar33 = 0x2c;
                pcVar18 = "\ttmp[3] = ${VEC_TYPE}(coords.wxyz) * 0.125;\n";
LAB_00ef3fcf:
                if (3 < iVar8) goto LAB_00ef40b1;
              }
              else {
                if (lVar23 == 1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar27,"\ttmp[ui_zero]  = ${VEC_TYPE}(coords);\n",0x26);
                  if (1 < iVar8) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar27,
                               "\ttmp[ui_one]   = ${VEC_TYPE}(coords.yzwx) * 0.5;\n",0x31);
                  }
                  if (2 < iVar8) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar27,
                               "\ttmp[ui_two]   = ${VEC_TYPE}(coords.zwxy) * 0.25;\n",0x32);
                  }
                  lVar33 = 0x33;
                  pcVar18 = "\ttmp[ui_three] = ${VEC_TYPE}(coords.wxyz) * 0.125;\n";
                  goto LAB_00ef3fcf;
                }
                if (lVar23 == 2) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar27,"\tfor (int i = 0; i < ",0x15);
                  poVar15 = (ostringstream *)std::ostream::operator<<(poVar27,iVar8);
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar27,"\tfor (int i = 0; i < ",0x15);
                  poVar15 = poVar27;
                  if (pcVar25 == (char *)0x0) {
                    std::ios::clear(iVar4 + (int)*(undefined8 *)(*(long *)poVar27 + -0x18));
                  }
                  else {
                    sVar14 = strlen(pcVar25);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar27,pcVar25,sVar14);
                  }
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar15,"; i++)\n",7);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar27,"\t{\n",3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar27,"\t\ttmp[i] = ${VEC_TYPE}(coords);\n",0x20);
                lVar33 = 3;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar27,"\t\tcoords = coords.yzwx * 0.5;\n",0x1e);
                pcVar18 = "\t}\n";
LAB_00ef40b1:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar27,pcVar18,lVar33);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar27,"\t${PRECISION} ${VEC_TYPE} res = ${VEC_TYPE}(0.0);\n",
                         0x32);
              if (lVar24 == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar27,"\tres += tmp[0];\n",0x10);
                if (1 < iVar8) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar27,"\tres += tmp[1];\n",0x10);
                }
                if (2 < iVar8) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar27,"\tres += tmp[2];\n",0x10);
                }
                lVar33 = 0x10;
                pcVar25 = "\tres += tmp[3];\n";
LAB_00ef4193:
                if (3 < iVar8) goto LAB_00ef4239;
              }
              else {
                if (lVar24 == 1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar27,"\tres += tmp[ui_zero];\n",0x16);
                  if (1 < iVar8) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar27,"\tres += tmp[ui_one];\n",0x15);
                  }
                  if (2 < iVar8) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar27,"\tres += tmp[ui_two];\n",0x15);
                  }
                  lVar33 = 0x17;
                  pcVar25 = "\tres += tmp[ui_three];\n";
                  goto LAB_00ef4193;
                }
                if (lVar24 == 2) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar27,"\tfor (int i = 0; i < ",0x15);
                  poVar15 = (ostringstream *)std::ostream::operator<<(poVar27,iVar8);
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar27,"\tfor (int i = 0; i < ",0x15);
                  poVar15 = poVar27;
                  if (pcVar25 == (char *)0x0) {
                    std::ios::clear(iVar4 + (int)*(undefined8 *)(*(long *)poVar27 + -0x18));
                  }
                  else {
                    sVar14 = strlen(pcVar25);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar27,pcVar25,sVar14);
                  }
                }
                lVar33 = 0x11;
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar15,"; i++)\n",7);
                pcVar25 = "\t\tres += tmp[i];\n";
LAB_00ef4239:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar27,pcVar25,lVar33);
              }
              if (lVar17 == 0) {
                lVar33 = 0x19;
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "\tv_color = vec4(res${PADDING});\n",0x20);
                pcVar25 = "\tgl_FragColor = v_color;\n";
              }
              else {
                lVar33 = 0x25;
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "\tv_coords = a_coords;\n",0x16);
                pcVar25 = "\tgl_FragColor = vec4(res${PADDING});\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar25,lVar33);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"}\n",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"}\n",2);
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header;
              params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(DVar30);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[9],_const_char_*,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [9])"MAT_TYPE",(char **)&fragTemplate);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_498._M_p != &local_488) {
                operator_delete(local_498._M_p,local_488._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(dataType);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[9],_const_char_*,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [9])"VEC_TYPE",(char **)&fragTemplate);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_498._M_p != &local_488) {
                operator_delete(local_498._M_p,local_488._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [10])0x1cf2bdb,(char (*) [8])0x1c00dfd);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_498._M_p != &local_488) {
                operator_delete(local_498._M_p,local_488._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if (iVar8 == 3) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [6])0x1bbf031);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              else if (iVar8 == 2) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [11])0x1bbf02c);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              else {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",
                           (char (*) [1])(glcts::fixed_sample_locations_values + 1));
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_498._M_p != &local_488) {
                operator_delete(local_498._M_p,local_488._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&fragTemplate.m_template,vertexShaderSource._M_dataplus._M_p,
                         (allocator<char> *)&local_3f8);
              tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vertexShaderSource,local_3f8._M_dataplus._M_p,&local_451);
              tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                operator_delete(local_3f8._M_dataplus._M_p,
                                local_3f8.field_2._M_allocated_capacity + 1);
              }
              tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
              tcu::StringTemplate::specialize(&local_3f8,&fragTemplate,&params);
              evalFunc = evalSubscriptMat2;
              if (DVar30 != TYPE_FLOAT_MAT2) {
                if (DVar30 == TYPE_FLOAT_MAT4) {
                  evalFunc = evalSubscriptMat4;
                }
                else if (DVar30 == TYPE_FLOAT_MAT3) {
                  evalFunc = evalSubscriptMat3;
                }
                else {
                  evalFunc = (ShaderEvalFunc)0x0;
                }
              }
              pSVar13 = (ShaderIndexingCase *)operator_new(0x130);
              dVar3 = (uint)(lVar17 != 0) * 2 + 3;
              if (lVar24 != 3 && lVar23 != 3) {
                dVar3 = (deUint32)local_3d0;
              }
              ShaderIndexingCase::ShaderIndexingCase
                        (pSVar13,pCVar1,_Var6._M_p,_Var5._M_p,lVar17 == 0,DVar30,evalFunc,dVar3,
                         vertexShaderSource._M_dataplus._M_p,local_3f8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                operator_delete(local_3f8._M_dataplus._M_p,
                                local_3f8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              tcu::StringTemplate::~StringTemplate(&fragTemplate);
              tcu::StringTemplate::~StringTemplate(&vertTemplate);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(&params._M_t);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
              std::ios_base::~ios_base
                        ((ios_base *)
                         &frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
              std::ios_base::~ios_base
                        ((ios_base *)
                         &vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
              tcu::TestNode::addChild(pTVar10,(TestNode *)pSVar13);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)desc._M_dataplus._M_p != &desc.field_2) {
                operator_delete(desc._M_dataplus._M_p,desc.field_2._M_allocated_capacity + 1);
              }
              paVar16 = &name.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)name._M_dataplus._M_p != paVar16) {
                operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
                paVar16 = extraout_RAX;
              }
              lVar17 = lVar17 + 4;
            } while (lVar17 == 4);
            lVar24 = lVar24 + 1;
          } while (lVar24 != 4);
          lVar23 = lVar23 + 1;
        } while (lVar23 != 4);
        local_348 = local_348 + 1;
        if (local_348 == 3) {
          return (int)paVar16;
        }
      } while( true );
    }
  } while( true );
}

Assistant:

void ShaderIndexingTests::init (void)
{
	static const ShaderType s_shaderTypes[] =
	{
		SHADERTYPE_VERTEX,
		SHADERTYPE_FRAGMENT
	};

	static const DataType s_floatAndVecTypes[] =
	{
		TYPE_FLOAT,
		TYPE_FLOAT_VEC2,
		TYPE_FLOAT_VEC3,
		TYPE_FLOAT_VEC4
	};

	// Varying array access cases.
	{
		TestCaseGroup* varyingGroup = new TestCaseGroup(m_context, "varying_array", "Varying array access tests.");
		addChild(varyingGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_floatAndVecTypes); typeNdx++)
		{
			DataType varType = s_floatAndVecTypes[typeNdx];
			for (int vertAccess = 0; vertAccess < INDEXACCESS_LAST; vertAccess++)
			{
				for (int fragAccess = 0; fragAccess < INDEXACCESS_LAST; fragAccess++)
				{
					const char* vertAccessName = getIndexAccessTypeName((IndexAccessType)vertAccess);
					const char* fragAccessName = getIndexAccessTypeName((IndexAccessType)fragAccess);
					string name = string(getDataTypeName(varType)) + "_" + vertAccessName + "_write_" + fragAccessName + "_read";
					string desc = string("Varying array with ") + vertAccessName + " write in vertex shader and " + fragAccessName + " read in fragment shader.";
					varyingGroup->addChild(createVaryingArrayCase(m_context, name.c_str(), desc.c_str(), varType, (IndexAccessType)vertAccess, (IndexAccessType)fragAccess));
				}
			}
		}
	}

	// Uniform array access cases.
	{
		TestCaseGroup* uniformGroup = new TestCaseGroup(m_context, "uniform_array", "Uniform array access tests.");
		addChild(uniformGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_floatAndVecTypes); typeNdx++)
		{
			DataType varType = s_floatAndVecTypes[typeNdx];
			for (int readAccess = 0; readAccess < INDEXACCESS_LAST; readAccess++)
			{
				const char* readAccessName = getIndexAccessTypeName((IndexAccessType)readAccess);
				for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
				{
					ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
					const char*	shaderTypeName	= getShaderTypeName(shaderType);
					string		name			= string(getDataTypeName(varType)) + "_" + readAccessName + "_read_" + shaderTypeName;
					string		desc			= string("Uniform array with ") + readAccessName + " read in " + shaderTypeName + " shader.";
					bool isVertexCase = ((ShaderType)shaderType == SHADERTYPE_VERTEX);
					uniformGroup->addChild(createUniformArrayCase(m_context, name.c_str(), desc.c_str(), isVertexCase, varType, (IndexAccessType)readAccess));
				}
			}
		}
	}

	// Temporary array access cases.
	{
		TestCaseGroup* tmpGroup = new TestCaseGroup(m_context, "tmp_array", "Temporary array access tests.");
		addChild(tmpGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_floatAndVecTypes); typeNdx++)
		{
			DataType varType = s_floatAndVecTypes[typeNdx];
			for (int writeAccess = 0; writeAccess < INDEXACCESS_LAST; writeAccess++)
			{
				for (int readAccess = 0; readAccess < INDEXACCESS_LAST; readAccess++)
				{
					const char* writeAccessName = getIndexAccessTypeName((IndexAccessType)writeAccess);
					const char* readAccessName = getIndexAccessTypeName((IndexAccessType)readAccess);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
						const char* shaderTypeName	= getShaderTypeName(shaderType);
						string		name			= string(getDataTypeName(varType)) + "_" + writeAccessName + "_write_" + readAccessName + "_read_" + shaderTypeName;
						string		desc			= string("Temporary array with ") + writeAccessName + " write and " + readAccessName + " read in " + shaderTypeName + " shader.";
						bool		isVertexCase	= ((ShaderType)shaderType == SHADERTYPE_VERTEX);
						tmpGroup->addChild(createTmpArrayCase(m_context, name.c_str(), desc.c_str(), isVertexCase, varType, (IndexAccessType)writeAccess, (IndexAccessType)readAccess));
					}
				}
			}
		}
	}

	// Vector indexing with subscripts.
	{
		TestCaseGroup* vecGroup = new TestCaseGroup(m_context, "vector_subscript", "Vector subscript indexing.");
		addChild(vecGroup);

		static const DataType s_vectorTypes[] =
		{
			TYPE_FLOAT_VEC2,
			TYPE_FLOAT_VEC3,
			TYPE_FLOAT_VEC4
		};

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_vectorTypes); typeNdx++)
		{
			DataType varType = s_vectorTypes[typeNdx];
			for (int writeAccess = 0; writeAccess < VECTORACCESS_LAST; writeAccess++)
			{
				for (int readAccess = 0; readAccess < VECTORACCESS_LAST; readAccess++)
				{
					const char* writeAccessName = getVectorAccessTypeName((VectorAccessType)writeAccess);
					const char* readAccessName = getVectorAccessTypeName((VectorAccessType)readAccess);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
						const char* shaderTypeName	= getShaderTypeName(shaderType);
						string		name			= string(getDataTypeName(varType)) + "_" + writeAccessName + "_write_" + readAccessName + "_read_" + shaderTypeName;
						string		desc			= string("Vector subscript access with ") + writeAccessName + " write and " + readAccessName + " read in " + shaderTypeName + " shader.";
						bool		isVertexCase	= ((ShaderType)shaderType == SHADERTYPE_VERTEX);
						vecGroup->addChild(createVectorSubscriptCase(m_context, name.c_str(), desc.c_str(), isVertexCase, varType, (VectorAccessType)writeAccess, (VectorAccessType)readAccess));
					}
				}
			}
		}
	}

	// Matrix indexing with subscripts.
	{
		TestCaseGroup* matGroup = new TestCaseGroup(m_context, "matrix_subscript", "Matrix subscript indexing.");
		addChild(matGroup);

		static const DataType s_matrixTypes[] =
		{
			TYPE_FLOAT_MAT2,
			TYPE_FLOAT_MAT3,
			TYPE_FLOAT_MAT4
		};

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_matrixTypes); typeNdx++)
		{
			DataType varType = s_matrixTypes[typeNdx];
			for (int writeAccess = 0; writeAccess < INDEXACCESS_LAST; writeAccess++)
			{
				for (int readAccess = 0; readAccess < INDEXACCESS_LAST; readAccess++)
				{
					const char* writeAccessName = getIndexAccessTypeName((IndexAccessType)writeAccess);
					const char* readAccessName = getIndexAccessTypeName((IndexAccessType)readAccess);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
						const char* shaderTypeName	= getShaderTypeName(shaderType);
						string		name			= string(getDataTypeName(varType)) + "_" + writeAccessName + "_write_" + readAccessName + "_read_" + shaderTypeName;
						string		desc			= string("Vector subscript access with ") + writeAccessName + " write and " + readAccessName + " read in " + shaderTypeName + " shader.";
						bool		isVertexCase	= ((ShaderType)shaderType == SHADERTYPE_VERTEX);
						matGroup->addChild(createMatrixSubscriptCase(m_context, name.c_str(), desc.c_str(), isVertexCase, varType, (IndexAccessType)writeAccess, (IndexAccessType)readAccess));
					}
				}
			}
		}
	}
}